

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToRelativePath
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  bool bVar1;
  cmStateDirectory local_50;
  string *local_28;
  string *remote_path_local;
  string *local_path_local;
  cmOutputConverter *this_local;
  
  local_28 = remote_path;
  remote_path_local = param_1;
  local_path_local = (string *)this;
  this_local = (cmOutputConverter *)__return_storage_ptr__;
  cmStateSnapshot::GetDirectory(&local_50,&this->StateSnapshot);
  bVar1 = ContainedInDirectory(param_1,remote_path,&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ForceToRelativePath(__return_storage_ptr__,remote_path_local,local_28);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToRelativePath(
  std::string const& local_path, std::string const& remote_path) const
{
  if (!ContainedInDirectory(local_path, remote_path,
                            this->StateSnapshot.GetDirectory())) {
    return remote_path;
  }

  return this->ForceToRelativePath(local_path, remote_path);
}